

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

void mi_heap_free(mi_heap_t *heap)

{
  mi_heap_t *pmVar1;
  mi_tld_t *pmVar2;
  mi_heap_t *pmVar3;
  mi_heap_t **ppmVar4;
  long in_FS_OFFSET;
  
  if (heap != &_mi_heap_empty) {
    pmVar2 = heap->tld;
    if (pmVar2->heap_backing != heap) {
      if (*(mi_heap_t **)(in_FS_OFFSET + -0x60) == heap) {
        _mi_heap_set_default_direct(pmVar2->heap_backing);
        pmVar2 = heap->tld;
      }
      pmVar1 = (mi_heap_t *)0x0;
      ppmVar4 = &pmVar2->heaps;
      do {
        pmVar3 = pmVar1;
        pmVar1 = *ppmVar4;
        if (pmVar1 == heap) break;
        ppmVar4 = &pmVar1->next;
      } while (pmVar1 != (mi_heap_t *)0x0);
      if (pmVar1 == heap) {
        ppmVar4 = &pmVar3->next;
        if (pmVar3 == (mi_heap_t *)0x0) {
          ppmVar4 = &pmVar2->heaps;
        }
        *ppmVar4 = heap->next;
      }
      mi_free(heap);
      return;
    }
  }
  return;
}

Assistant:

static void mi_heap_free(mi_heap_t* heap) {
  mi_assert(heap != NULL);
  mi_assert_internal(mi_heap_is_initialized(heap));
  if (heap==NULL || !mi_heap_is_initialized(heap)) return;
  if (mi_heap_is_backing(heap)) return; // dont free the backing heap

  // reset default
  if (mi_heap_is_default(heap)) {
    _mi_heap_set_default_direct(heap->tld->heap_backing);
  }

  // remove ourselves from the thread local heaps list
  // linear search but we expect the number of heaps to be relatively small
  mi_heap_t* prev = NULL;
  mi_heap_t* curr = heap->tld->heaps;
  while (curr != heap && curr != NULL) {
    prev = curr;
    curr = curr->next;
  }
  mi_assert_internal(curr == heap);
  if (curr == heap) {
    if (prev != NULL) { prev->next = heap->next; }
                 else { heap->tld->heaps = heap->next; }
  }
  mi_assert_internal(heap->tld->heaps != NULL);

  // and free the used memory
  mi_free(heap);
}